

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatImage.cpp
# Opt level: O3

float __thiscall
nv::FloatImage::applyKernelVertical(FloatImage *this,Kernel1 *k,int x,int y,uint c,WrapMode wm)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  float fVar14;
  
  uVar3 = k->m_windowSize;
  if ((ulong)uVar3 == 0) {
    fVar14 = 0.0;
  }
  else {
    uVar1 = this->m_width;
    uVar2 = this->m_height;
    uVar8 = 0;
    if (0 < x) {
      uVar8 = x;
    }
    if (uVar1 <= uVar8) {
      uVar8 = uVar1 - 1;
    }
    uVar11 = (uint)uVar1;
    uVar5 = x;
    if (uVar11 == 1) {
      uVar5 = 0;
    }
    uVar4 = -uVar5;
    if (0 < (int)uVar5) {
      uVar4 = uVar5;
    }
    fVar14 = 0.0;
    uVar10 = 0;
    do {
      uVar5 = (y - (uVar3 >> 1)) + 1 + (int)uVar10;
      uVar12 = (uint)uVar1;
      uVar13 = (uint)uVar2;
      if (wm == WrapMode_Repeat) {
        if ((int)uVar5 < 0) {
          uVar9 = ~(~uVar5 % (uint)uVar2) + uVar13;
        }
        else {
          uVar9 = uVar5 % (uint)uVar2;
        }
        if (x < 0) {
          uVar7 = ~((uint)~x % uVar11) + uVar12;
        }
        else {
          uVar7 = (uint)x % uVar12;
        }
LAB_001c71e3:
        iVar6 = uVar9 * uVar12 + uVar7;
      }
      else {
        uVar7 = uVar4;
        if (wm != WrapMode_Clamp) {
          while (uVar11 <= uVar7) {
            uVar9 = ((uVar1 - 2) + (uint)uVar1) - uVar7;
            uVar7 = -uVar9;
            if (0 < (int)uVar9) {
              uVar7 = uVar9;
            }
          }
          if (uVar2 == 1) {
            uVar5 = 0;
          }
          while( true ) {
            uVar9 = -uVar5;
            if (0 < (int)uVar5) {
              uVar9 = uVar5;
            }
            if (uVar9 < uVar13) break;
            uVar5 = ((uint)uVar2 * 2 + -2) - uVar9;
          }
          goto LAB_001c71e3;
        }
        if ((int)uVar5 < 1) {
          uVar5 = 0;
        }
        if (uVar13 <= uVar5) {
          uVar5 = uVar2 - 1;
        }
        iVar6 = uVar5 * uVar12 + uVar8;
      }
      fVar14 = fVar14 + k->m_data[uVar10] *
                        this->m_mem[(ulong)(c * uVar1 * (uint)uVar2) + (long)iVar6];
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar3);
  }
  return fVar14;
}

Assistant:

float FloatImage::applyKernelVertical(const Kernel1 * k, int x, int y, uint c, WrapMode wm) const
{
	nvDebugCheck(k != NULL);
	
	const uint kernelWindow = k->windowSize();
	const int kernelOffset = int(kernelWindow / 2) - 1;
	
	const float * channel = this->channel(c);

	float sum = 0.0f;
	for (uint i = 0; i < kernelWindow; i++)
	{
		const int src_y = int(y + i) - kernelOffset;
		const int idx = this->index(x, src_y, wm);
		
		sum += k->valueAt(i) * channel[idx];
	}
	
	return sum;
}